

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O3

void __thiscall Camera::updateCameraVectors(Camera *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  dVar3 = cos((double)(this->Yaw * 0.017453292));
  dVar4 = cos((double)(this->Pitch * 0.017453292));
  dVar5 = sin((double)(this->Pitch * 0.017453292));
  fVar7 = (float)dVar5;
  dVar5 = sin((double)(this->Yaw * 0.017453292));
  dVar6 = cos((double)(this->Pitch * 0.017453292));
  fVar8 = (float)(dVar4 * dVar3);
  fVar9 = (float)(dVar6 * dVar5);
  fVar11 = 1.0 / SQRT(fVar9 * fVar9 + fVar7 * fVar7 + fVar8 * fVar8);
  fVar8 = fVar11 * fVar8;
  fVar10 = (this->WorldUp).field_0.x;
  fVar7 = fVar7 * fVar11;
  fVar9 = fVar9 * fVar11;
  (this->Front).field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)fVar8;
  (this->Front).field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)fVar7;
  (this->Front).field_2.z = fVar9;
  uVar1 = (this->WorldUp).field_1;
  uVar2 = (this->WorldUp).field_2;
  fVar11 = (float)uVar2 * fVar7 - fVar9 * (float)uVar1;
  fVar12 = fVar10 * fVar9 - fVar8 * (float)uVar2;
  fVar10 = (float)uVar1 * fVar8 - fVar7 * fVar10;
  fVar13 = 1.0 / SQRT(fVar12 * fVar12 + fVar11 * fVar11 + fVar10 * fVar10);
  fVar10 = fVar10 * fVar13;
  fVar11 = fVar13 * fVar11;
  fVar13 = fVar13 * fVar12;
  (this->Right).field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)fVar11;
  (this->Right).field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)fVar13;
  (this->Right).field_2.z = fVar10;
  fVar12 = fVar13 * fVar9 - fVar10 * fVar7;
  fVar9 = fVar10 * fVar8 - fVar9 * fVar11;
  fVar7 = fVar11 * fVar7 - fVar13 * fVar8;
  fVar10 = 1.0 / SQRT(fVar7 * fVar7 + fVar9 * fVar9 + fVar12 * fVar12);
  (this->Up).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(fVar12 * fVar10);
  (this->Up).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(fVar9 * fVar10);
  (this->Up).field_2.z = fVar10 * fVar7;
  return;
}

Assistant:

void updateCameraVectors() {
        // Calculate the new Front vector
        glm::vec3 front;
        front.x = cos(glm::radians(this->Yaw)) * cos(glm::radians(this->Pitch));
        front.y = sin(glm::radians(this->Pitch));
        front.z = sin(glm::radians(this->Yaw)) * cos(glm::radians(this->Pitch));
        // Normalize the vectors, because their length gets closer to 0 the more you look up or down
        // which results in slower movement.
        this->Front = glm::normalize(front);
        // Also re-calculate the Right and Up vector
        this->Right = glm::normalize(glm::cross(this->Front, this->WorldUp));
        this->Up = glm::normalize(glm::cross(this->Right, this->Front));
    }